

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementFormControl.cpp
# Opt level: O2

void __thiscall Rml::ElementFormControl::SetDisabled(ElementFormControl *this,bool disable)

{
  undefined7 in_register_00000031;
  allocator<char> local_29;
  String local_28;
  
  if ((int)CONCAT71(in_register_00000031,disable) == 0) {
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"disabled",&local_29);
    Element::RemoveAttribute(&this->super_Element,&local_28);
  }
  else {
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"disabled",&local_29);
    Element::SetAttribute<char[1]>(&this->super_Element,&local_28,(char (*) [1])0x329d03);
  }
  ::std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void ElementFormControl::SetDisabled(bool disable)
{
	if (disable)
		SetAttribute("disabled", "");
	else
		RemoveAttribute("disabled");
}